

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O1

int nghttp2_bufs_realloc(nghttp2_bufs *bufs,size_t chunk_length)

{
  uint8_t **ppuVar1;
  size_t sVar2;
  int iVar3;
  nghttp2_buf_chain *chain;
  nghttp2_buf_chain *local_18;
  
  iVar3 = -0x1f5;
  if (bufs->offset <= chunk_length) {
    local_18 = (nghttp2_buf_chain *)0xfffffe0b;
    iVar3 = buf_chain_new(&local_18,chunk_length,bufs->mem);
    if (iVar3 == 0) {
      nghttp2_bufs_free(bufs);
      bufs->head = local_18;
      bufs->cur = local_18;
      sVar2 = bufs->offset;
      ppuVar1 = &(local_18->buf).pos;
      *ppuVar1 = *ppuVar1 + sVar2;
      ppuVar1 = &(local_18->buf).last;
      *ppuVar1 = *ppuVar1 + sVar2;
      bufs->chunk_length = chunk_length;
      bufs->chunk_used = 1;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int nghttp2_bufs_realloc(nghttp2_bufs *bufs, size_t chunk_length) {
  int rv;
  nghttp2_buf_chain *chain;

  if (chunk_length < bufs->offset) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  rv = buf_chain_new(&chain, chunk_length, bufs->mem);
  if (rv != 0) {
    return rv;
  }

  nghttp2_bufs_free(bufs);

  bufs->head = chain;
  bufs->cur = bufs->head;

  nghttp2_buf_shift_right(&bufs->cur->buf, bufs->offset);

  bufs->chunk_length = chunk_length;
  bufs->chunk_used = 1;

  return 0;
}